

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

void mkcavearea(boolean rockit)

{
  undefined1 *puVar1;
  bool bVar2;
  level *plVar3;
  xchar xVar4;
  int iVar5;
  char cVar6;
  byte bVar7;
  byte y;
  xchar xVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong in_R8;
  char cVar16;
  byte bVar17;
  ulong uVar18;
  byte x;
  ulong uVar19;
  
  uVar19 = (ulong)u.ux;
  uVar18 = (ulong)u.uy;
  cVar6 = level->locations[uVar19][uVar18].typ;
  if ((cVar6 == '\x19') && ((level->locations[uVar19][uVar18].field_0x7 & 8) != 0)) {
LAB_001677dd:
    bVar7 = 1;
    bVar2 = false;
  }
  else {
    bVar7 = u.ux - 2;
    in_R8 = 1;
    bVar2 = true;
    if ((int)(char)bVar7 < u.ux + 3) {
      in_R8 = (ulong)(uint)(int)(char)(u.uy + -1);
      do {
        if ((int)(char)(u.uy + -1) < u.uy + 2) {
          uVar9 = uVar18 & 0xffffffff;
          do {
            uVar11 = (int)uVar9 - 1;
            if (((byte)uVar11 < 0x15 && (byte)(bVar7 - 1) < 0x4f) &&
               ((level->locations[bVar7][uVar11 & 0xff].field_0x7 & 8) != 0)) goto LAB_001677dd;
            cVar16 = (char)uVar9;
            uVar9 = (ulong)(byte)(cVar16 + 1);
          } while ((int)cVar16 < u.uy + 2);
        }
        bVar7 = bVar7 + 1;
      } while ((int)(char)bVar7 < u.ux + 3);
    }
    bVar7 = 0;
  }
  if (rockit == '\0') {
    pcVar12 = "extends the";
    if (cVar6 == '\x18') {
      pcVar12 = "creates a";
    }
    pline("A mysterious force %s cave around you!",pcVar12);
  }
  else {
    pline("Crash!  The ceiling collapses around you!");
  }
  (*windowprocs.win_pause)(P_MESSAGE);
  iVar5 = 1;
  cVar6 = '\x01';
  uVar11 = (uint)bVar7;
  uVar9 = uVar18 & 0xffffffff;
  uVar13 = uVar19 & 0xffffffff;
  do {
    y = (byte)uVar9;
    x = (char)uVar19 + 1;
    uVar19 = (ulong)x;
    cVar16 = (char)uVar13;
    if (iVar5 != 2) {
      y = y - 1;
      bVar17 = (char)uVar18 + 1;
      uVar18 = (ulong)bVar17;
      if (cVar16 < (char)x) {
        cVar10 = '\0';
        do {
          mkcavepos(cVar16 + cVar10,y,uVar11,rockit,(boolean)in_R8);
          mkcavepos(cVar16 + cVar10,bVar17,(uint)bVar7,rockit,(boolean)in_R8);
          cVar10 = cVar10 + '\x01';
        } while (cVar6 != cVar10);
      }
    }
    uVar13 = (ulong)(byte)(cVar16 - 1U);
    for (bVar17 = y; (char)bVar17 <= (char)uVar18; bVar17 = bVar17 + 1) {
      mkcavepos(cVar16 - 1U,bVar17,uVar11,rockit,(boolean)in_R8);
      mkcavepos(x,bVar17,uVar11,rockit,(boolean)in_R8);
    }
    flush_screen();
    (*windowprocs.win_delay)();
    plVar3 = level;
    xVar8 = u.uy;
    xVar4 = u.ux;
    iVar5 = iVar5 + 1;
    cVar6 = cVar6 + '\x02';
    uVar9 = (ulong)y;
  } while (iVar5 != 3);
  if (rockit == '\0') {
    lVar14 = (long)u.ux;
    lVar15 = (long)u.uy;
    if (level->locations[lVar14][lVar15].typ == '\x18') {
      level->locations[lVar14][lVar15].typ = '\x19';
      if (!bVar2) {
        puVar1 = &plVar3->locations[lVar14][lVar15].field_0x7;
        *puVar1 = *puVar1 | 8;
        xVar4 = u.ux;
        xVar8 = u.uy;
      }
      newsym((int)xVar4,(int)xVar8);
    }
  }
  vision_full_recalc = '\x01';
  return;
}

Assistant:

static void mkcavearea(boolean rockit)
{
    int dist;
    xchar xmin = u.ux, xmax = u.ux;
    xchar ymin = u.uy, ymax = u.uy;
    xchar i;
    boolean waslit = rm_waslit();

    if (rockit) pline("Crash!  The ceiling collapses around you!");
    else pline("A mysterious force %s cave around you!",
	     (level->locations[u.ux][u.uy].typ == CORR) ? "creates a" : "extends the");
    win_pause_output(P_MESSAGE);

    for (dist = 1; dist <= 2; dist++) {
	xmin--; xmax++;

	/* top and bottom */
	if (dist < 2) { /* the area is wider that it is high */
	    ymin--; ymax++;
	    for (i = xmin+1; i < xmax; i++) {
		mkcavepos(i, ymin, dist, waslit, rockit);
		mkcavepos(i, ymax, dist, waslit, rockit);
	    }
	}

	/* left and right */
	for (i = ymin; i <= ymax; i++) {
	    mkcavepos(xmin, i, dist, waslit, rockit);
	    mkcavepos(xmax, i, dist, waslit, rockit);
	}

	flush_screen();	/* make sure the new glyphs shows up */
	win_delay_output();
    }

    if (!rockit && level->locations[u.ux][u.uy].typ == CORR) {
	level->locations[u.ux][u.uy].typ = ROOM;
	if (waslit) level->locations[u.ux][u.uy].waslit = TRUE;
	newsym(u.ux, u.uy); /* in case player is invisible */
    }

    vision_full_recalc = 1;	/* everything changed */
}